

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

void __thiscall
spvtools::val::ValidationState_t::RegisterDebugInstruction
          (ValidationState_t *this,Instruction *inst)

{
  uint16_t uVar1;
  uint id;
  string *name;
  string str;
  string local_60;
  string local_40;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 == 6) {
    id = Instruction::GetOperandAs<unsigned_int>(inst,0);
    Instruction::GetOperandAs<std::__cxx11::string>(&str,inst,2);
    name = &local_60;
  }
  else {
    if (uVar1 != 5) {
      return;
    }
    id = Instruction::GetOperandAs<unsigned_int>(inst,0);
    Instruction::GetOperandAs<std::__cxx11::string>(&str,inst,1);
    name = &local_40;
  }
  std::__cxx11::string::string((string *)name,(string *)&str);
  AssignNameToId(this,id,name);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void ValidationState_t::RegisterDebugInstruction(const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpName: {
      const auto target = inst->GetOperandAs<uint32_t>(0);
      const std::string str = inst->GetOperandAs<std::string>(1);
      AssignNameToId(target, str);
      break;
    }
    case spv::Op::OpMemberName: {
      const auto target = inst->GetOperandAs<uint32_t>(0);
      const std::string str = inst->GetOperandAs<std::string>(2);
      AssignNameToId(target, str);
      break;
    }
    case spv::Op::OpSourceContinued:
    case spv::Op::OpSource:
    case spv::Op::OpSourceExtension:
    case spv::Op::OpString:
    case spv::Op::OpLine:
    case spv::Op::OpNoLine:
    default:
      break;
  }
}